

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textures.cpp
# Opt level: O0

SpectrumDotsTexture *
pbrt::SpectrumDotsTexture::Create
          (Transform *renderFromTexture,TextureParameterDictionary *parameters,FileLoc *loc,
          Allocator alloc)

{
  SpectrumDotsTexture *pSVar1;
  TaggedPointer<pbrt::UVMapping2D,_pbrt::SphericalMapping2D,_pbrt::CylindricalMapping2D,_pbrt::PlanarMapping2D>
  in_RCX;
  TextureParameterDictionary *in_RSI;
  SpectrumHandle one;
  SpectrumHandle zero;
  TextureMapping2DHandle map;
  FileLoc *in_stack_00000360;
  Transform *in_stack_00000368;
  ParameterDictionary *in_stack_00000370;
  Allocator in_stack_00000378;
  SpectrumHandle *in_stack_fffffffffffffee8;
  SpectrumHandle *in_stack_fffffffffffffef0;
  double *in_stack_fffffffffffffef8;
  polymorphic_allocator<std::byte> *in_stack_ffffffffffffff00;
  SpectrumTextureHandle *args_1;
  TextureMapping2DHandle *args;
  TextureParameterDictionary *this;
  string *name;
  TextureParameterDictionary *in_stack_ffffffffffffff20;
  Allocator in_stack_ffffffffffffff28;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff30;
  string local_c8 [40];
  TaggedPointer<pbrt::UVMapping2D,_pbrt::SphericalMapping2D,_pbrt::CylindricalMapping2D,_pbrt::PlanarMapping2D>
  local_a0;
  undefined1 local_79 [41];
  undefined8 local_50;
  undefined8 local_40;
  TaggedPointer<pbrt::UVMapping2D,_pbrt::SphericalMapping2D,_pbrt::CylindricalMapping2D,_pbrt::PlanarMapping2D>
  local_30;
  TextureParameterDictionary *local_18;
  TextureMapping2DHandle local_8;
  
  local_18 = in_RSI;
  local_8.
  super_TaggedPointer<pbrt::UVMapping2D,_pbrt::SphericalMapping2D,_pbrt::CylindricalMapping2D,_pbrt::PlanarMapping2D>
  .bits = (TaggedPointer<pbrt::UVMapping2D,_pbrt::SphericalMapping2D,_pbrt::CylindricalMapping2D,_pbrt::PlanarMapping2D>
           )(TaggedPointer<pbrt::UVMapping2D,_pbrt::SphericalMapping2D,_pbrt::CylindricalMapping2D,_pbrt::PlanarMapping2D>
             )in_RCX.bits;
  TextureParameterDictionary::operator_cast_to_ParameterDictionary_(in_RSI);
  local_30 = local_8.
             super_TaggedPointer<pbrt::UVMapping2D,_pbrt::SphericalMapping2D,_pbrt::CylindricalMapping2D,_pbrt::PlanarMapping2D>
             .bits;
  TextureMapping2DHandle::Create
            (in_stack_00000370,in_stack_00000368,in_stack_00000360,in_stack_00000378);
  local_40 = 0;
  args = &local_8;
  pstd::pmr::polymorphic_allocator<std::byte>::new_object<pbrt::ConstantSpectrum,double>
            (in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
  SpectrumHandle::TaggedPointer<pbrt::ConstantSpectrum>
            (in_stack_fffffffffffffef0,(ConstantSpectrum *)in_stack_fffffffffffffee8);
  local_50 = 0x3ff0000000000000;
  pstd::pmr::polymorphic_allocator<std::byte>::new_object<pbrt::ConstantSpectrum,double>
            (in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
  SpectrumHandle::TaggedPointer<pbrt::ConstantSpectrum>
            (in_stack_fffffffffffffef0,(ConstantSpectrum *)in_stack_fffffffffffffee8);
  name = (string *)local_79;
  this = local_18;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffff30,(char *)in_stack_ffffffffffffff28.memoryResource,
             (allocator<char> *)in_stack_ffffffffffffff20);
  SpectrumHandle::SpectrumHandle(in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
  local_a0 = local_8.
             super_TaggedPointer<pbrt::UVMapping2D,_pbrt::SphericalMapping2D,_pbrt::CylindricalMapping2D,_pbrt::PlanarMapping2D>
             .bits;
  TextureParameterDictionary::GetSpectrumTexture
            (in_stack_ffffffffffffff20,name,(SpectrumHandle *)this,
             (SpectrumType)((ulong)args >> 0x20),in_stack_ffffffffffffff28);
  args_1 = (SpectrumTextureHandle *)&stack0xffffffffffffff37;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffff30,(char *)in_stack_ffffffffffffff28.memoryResource,
             (allocator<char> *)in_stack_ffffffffffffff20);
  SpectrumHandle::SpectrumHandle(in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
  TextureParameterDictionary::GetSpectrumTexture
            ((TextureParameterDictionary *)
             local_8.
             super_TaggedPointer<pbrt::UVMapping2D,_pbrt::SphericalMapping2D,_pbrt::CylindricalMapping2D,_pbrt::PlanarMapping2D>
             .bits,name,(SpectrumHandle *)this,(SpectrumType)((ulong)args >> 0x20),
             in_stack_ffffffffffffff28);
  pSVar1 = pstd::pmr::polymorphic_allocator<std::byte>::
           new_object<pbrt::SpectrumDotsTexture,pbrt::TextureMapping2DHandle&,pbrt::SpectrumTextureHandle,pbrt::SpectrumTextureHandle>
                     ((polymorphic_allocator<std::byte> *)this,args,args_1,
                      (SpectrumTextureHandle *)local_18);
  std::__cxx11::string::~string(local_c8);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff37);
  std::__cxx11::string::~string((string *)(local_79 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_79);
  return pSVar1;
}

Assistant:

SpectrumDotsTexture *SpectrumDotsTexture::Create(
    const Transform &renderFromTexture, const TextureParameterDictionary &parameters,
    const FileLoc *loc, Allocator alloc) {
    // Initialize 2D texture mapping _map_ from _tp_
    TextureMapping2DHandle map =
        TextureMapping2DHandle::Create(parameters, renderFromTexture, loc, alloc);
    SpectrumHandle zero = alloc.new_object<ConstantSpectrum>(0.);
    SpectrumHandle one = alloc.new_object<ConstantSpectrum>(1.);

    return alloc.new_object<SpectrumDotsTexture>(
        map,
        parameters.GetSpectrumTexture("inside", one, SpectrumType::Reflectance, alloc),
        parameters.GetSpectrumTexture("outside", zero, SpectrumType::Reflectance, alloc));
}